

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612.cpp
# Opt level: O0

void __thiscall
LibGens::Ym2612Private::T_Update_Chan_Int<6>
          (Ym2612Private *this,channel_t *CH,int32_t *bufL,int32_t *bufR,int length)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int en3;
  int en2;
  int en1;
  int en0;
  int in3;
  int in2;
  int in1;
  int in0;
  int i;
  int not_end;
  int length_local;
  int32_t *bufR_local;
  int32_t *bufL_local;
  channel_t *CH_local;
  Ym2612Private *this_local;
  
  if (CH->_SLOT[2].Ecnt != 0x20000000 ||
      (CH->_SLOT[1].Ecnt != 0x20000000 || CH->_SLOT[3].Ecnt != 0x20000000)) {
    this->int_cnt = (this->state).Inter_Cnt;
    for (in1 = 0; in1 < length; in1 = in1 + 1) {
      iVar1 = CH->_SLOT[0].Fcnt;
      iVar2 = CH->_SLOT[2].Fcnt;
      iVar3 = CH->_SLOT[1].Fcnt;
      iVar4 = CH->_SLOT[3].Fcnt;
      CH->_SLOT[0].Fcnt = CH->_SLOT[0].Finc + CH->_SLOT[0].Fcnt;
      CH->_SLOT[2].Fcnt = CH->_SLOT[2].Finc + CH->_SLOT[2].Fcnt;
      CH->_SLOT[1].Fcnt = CH->_SLOT[1].Finc + CH->_SLOT[1].Fcnt;
      CH->_SLOT[3].Fcnt = CH->_SLOT[3].Finc + CH->_SLOT[3].Fcnt;
      iVar5 = *(int *)(ENV_TAB + (long)(CH->_SLOT[0].Ecnt >> 0x10) * 4);
      iVar6 = CH->_SLOT[0].TLL;
      iVar7 = *(int *)(ENV_TAB + (long)(CH->_SLOT[2].Ecnt >> 0x10) * 4);
      iVar8 = CH->_SLOT[2].TLL;
      iVar9 = *(int *)(ENV_TAB + (long)(CH->_SLOT[1].Ecnt >> 0x10) * 4);
      iVar10 = CH->_SLOT[1].TLL;
      iVar11 = *(int *)(ENV_TAB + (long)(CH->_SLOT[3].Ecnt >> 0x10) * 4);
      iVar12 = CH->_SLOT[3].TLL;
      iVar15 = CH->_SLOT[0].Einc + CH->_SLOT[0].Ecnt;
      CH->_SLOT[0].Ecnt = iVar15;
      if (CH->_SLOT[0].Ecmp <= iVar15) {
        (**(code **)(ENV_NEXT_EVENT + (long)CH->_SLOT[0].Ecurp * 8))(CH->_SLOT);
      }
      iVar15 = CH->_SLOT[2].Einc + CH->_SLOT[2].Ecnt;
      CH->_SLOT[2].Ecnt = iVar15;
      if (CH->_SLOT[2].Ecmp <= iVar15) {
        (**(code **)(ENV_NEXT_EVENT + (long)CH->_SLOT[2].Ecurp * 8))(CH->_SLOT + 2);
      }
      iVar15 = CH->_SLOT[1].Einc + CH->_SLOT[1].Ecnt;
      CH->_SLOT[1].Ecnt = iVar15;
      if (CH->_SLOT[1].Ecmp <= iVar15) {
        (**(code **)(ENV_NEXT_EVENT + (long)CH->_SLOT[1].Ecurp * 8))(CH->_SLOT + 1);
      }
      iVar15 = CH->_SLOT[3].Einc + CH->_SLOT[3].Ecnt;
      CH->_SLOT[3].Ecnt = iVar15;
      if (CH->_SLOT[3].Ecmp <= iVar15) {
        (**(code **)(ENV_NEXT_EVENT + (long)CH->_SLOT[3].Ecurp * 8))(CH->_SLOT + 3);
      }
      iVar15 = CH->S0_OUT[0];
      iVar13 = CH->S0_OUT[1];
      iVar14 = CH->FB;
      CH->S0_OUT[1] = CH->S0_OUT[0];
      CH->S0_OUT[0] =
           *(int *)(*(long *)(SIN_TAB +
                             (long)(int)((iVar15 + iVar13 >> ((byte)iVar14 & 0x1f)) + iVar1 >> 0xe &
                                        0xfff) * 8) + (long)(iVar5 + iVar6) * 4);
      CH->OUTd = *(int *)(*(long *)(SIN_TAB + (long)(int)(iVar4 >> 0xe & 0xfff) * 8) +
                         (long)(iVar11 + iVar12) * 4) +
                 *(int *)(*(long *)(SIN_TAB + (long)(int)(CH->S0_OUT[0] + iVar2 >> 0xe & 0xfff) * 8)
                         + (long)(iVar7 + iVar8) * 4) +
                 *(int *)(*(long *)(SIN_TAB + (long)(int)(iVar3 >> 0xe & 0xfff) * 8) +
                         (long)(iVar9 + iVar10) * 4) >> 0xe;
      if (LIMIT_CH_OUT < CH->OUTd) {
        CH->OUTd = LIMIT_CH_OUT;
      }
      else if (CH->OUTd < -LIMIT_CH_OUT) {
        CH->OUTd = -LIMIT_CH_OUT;
      }
      uVar16 = (this->state).Inter_Step + this->int_cnt;
      this->int_cnt = uVar16;
      if ((uVar16 & 0x4000) == 0) {
        in1 = in1 + -1;
      }
      else {
        this->int_cnt = this->int_cnt & 0x3fff;
        CH->Old_OUTd = (int)((this->int_cnt ^ 0x3fffU) * CH->OUTd + this->int_cnt * CH->Old_OUTd) >>
                       0xe;
        bufL[in1] = ((CH->Old_OUTd * CH->PANVolumeL) / 0xffff & CH->LEFT) + bufL[in1];
        bufR[in1] = ((CH->Old_OUTd * CH->PANVolumeR) / 0xffff & CH->RIGHT) + bufR[in1];
      }
      CH->Old_OUTd = CH->OUTd;
    }
  }
  return;
}

Assistant:

inline void Ym2612Private::T_Update_Chan_Int(channel_t *CH, int32_t *bufL, int32_t *bufR, int length)
{
	// Check if the channel has reached the end of the update.
	{
		int not_end = (CH->_SLOT[S3].Ecnt - ENV_END);

		// Special cases.
		// Copied from Game_Music_Emu v0.5.2.
		if (algo == 7)
			not_end |= (CH->_SLOT[S0].Ecnt - ENV_END);
		if (algo >= 5)
			not_end |= (CH->_SLOT[S2].Ecnt - ENV_END);
		if (algo >= 4)
			not_end |= (CH->_SLOT[S1].Ecnt - ENV_END);

		if (not_end == 0)
			return;
	}

//	LOG_MSG(ym2612, LOG_MSG_LEVEL_DEBUG2,
//		"Algo %d Int len = %d", algo, length);

	int_cnt = state.Inter_Cnt;

	for (int i = 0; i < length; i++) {
		int in0, in1, in2, in3;		// current phase calculation
		int en0, en1, en2, en3;		// current envelope calculation

		GET_CURRENT_PHASE();
		UPDATE_PHASE();
		GET_CURRENT_ENV();
		UPDATE_ENV();

		assert(algo >= 0 && algo <= 7);
		switch (algo) {
			case 0:
				DO_ALGO_0();
				break;
			case 1:
				DO_ALGO_1();
				break;
			case 2:
				DO_ALGO_2();
				break;
			case 3:
				DO_ALGO_3();
				break;
			case 4:
				DO_ALGO_4();
				break;
			case 5:
				DO_ALGO_5();
				break;
			case 6:
				DO_ALGO_6();
				break;
			case 7:
				DO_ALGO_7();
				break;
			default:
				break;
		}

		DO_OUTPUT_INT();
	}
}